

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

void __thiscall pbrt::BilinearPatch::BilinearPatch(BilinearPatch *this,int meshIndex,int blpIndex)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int in_EDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  long *in_FS_OFFSET;
  type tVar4;
  type tVar5;
  undefined1 auVar12 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  Point3<float> PVar13;
  Vector3<float> VVar14;
  int j_1;
  int i_1;
  Float v_1;
  int j;
  Float u;
  int i;
  Point3f p [4] [4];
  int na;
  Point3f *p11;
  Point3f *p01;
  Point3f *p10;
  Point3f *p00;
  int *v;
  BilinearPatchMesh *mesh;
  Point3<float> *in_stack_fffffffffffffdf8;
  Point3<float> *in_stack_fffffffffffffe00;
  Point3<float> *in_stack_fffffffffffffe08;
  Point3<float> *in_stack_fffffffffffffe10;
  undefined8 *puVar15;
  undefined8 *local_1e8;
  Tuple3<pbrt::Point3,_float> *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined8 in_stack_fffffffffffffe50;
  int local_178;
  int local_174;
  int local_114;
  int local_10c;
  undefined8 local_108;
  float afStack_100 [26];
  BilinearPatch *in_stack_ffffffffffffff68;
  undefined8 uStack_48;
  Point3f *local_40;
  Point3f *local_38;
  Point3f *local_30;
  Point3f *local_28;
  int *local_20;
  BilinearPatchMesh *local_18;
  int local_10;
  undefined1 extraout_var [60];
  
  *in_RDI = in_ESI;
  in_RDI[1] = in_EDX;
  *(long *)(*in_FS_OFFSET + -0x478) = *(long *)(*in_FS_OFFSET + -0x478) + 0xc;
  local_10 = in_EDX;
  local_18 = GetMesh((BilinearPatch *)0x794c0c);
  local_20 = local_18->vertexIndices + (local_10 << 2);
  local_28 = local_18->p + *local_20;
  local_30 = local_18->p + local_20[1];
  local_38 = local_18->p + local_20[2];
  local_40 = local_18->p + local_20[3];
  bVar3 = IsRectangle(in_stack_ffffffffffffff68);
  if (bVar3) {
    tVar4 = Distance<float>(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    tVar5 = Distance<float>(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    in_RDI[2] = tVar4 * tVar5;
  }
  else {
    uStack_48._4_4_ = 3;
    local_1e8 = &local_108;
    puVar15 = &uStack_48;
    do {
      Point3<float>::Point3((Point3<float> *)0x794d6a);
      local_1e8 = (undefined8 *)((long)local_1e8 + 0xc);
    } while (local_1e8 != puVar15);
    for (local_10c = 0; local_10c < 4; local_10c = local_10c + 1) {
      for (local_114 = 0; local_114 < 4; local_114 = local_114 + 1) {
        auVar12 = (undefined1  [56])0x0;
        PVar13 = Lerp<pbrt::Point3,float>
                           ((Float)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                            (Tuple3<pbrt::Point3,_float> *)
                            CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                            in_stack_fffffffffffffe40);
        auVar7._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar7._8_56_ = auVar12;
        vmovlpd_avx(auVar7._0_16_);
        in_stack_fffffffffffffe00 = (Point3<float> *)0x0;
        PVar13 = Lerp<pbrt::Point3,float>
                           ((Float)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                            (Tuple3<pbrt::Point3,_float> *)
                            CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                            in_stack_fffffffffffffe40);
        in_stack_fffffffffffffdf8 = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar12 = (undefined1  [56])0x0;
        auVar2._8_8_ = in_stack_fffffffffffffe00;
        auVar2._0_8_ = in_stack_fffffffffffffdf8;
        vmovlpd_avx(auVar2);
        PVar13 = Lerp<pbrt::Point3,float>
                           ((Float)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                            (Tuple3<pbrt::Point3,_float> *)
                            CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                            in_stack_fffffffffffffe40);
        auVar6._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar6._8_56_ = auVar12;
        uVar1 = vmovlpd_avx(auVar6._0_16_);
        puVar15 = (undefined8 *)((long)&local_108 + (long)local_114 * 0xc + (long)local_10c * 0x30);
        *puVar15 = uVar1;
        *(float *)(puVar15 + 1) = PVar13.super_Tuple3<pbrt::Point3,_float>.z;
      }
    }
    auVar7 = ZEXT1664((undefined1  [16])0x0);
    in_RDI[2] = 0;
    for (local_174 = 0; local_174 < 3; local_174 = local_174 + 1) {
      for (local_178 = 0; auVar12 = auVar7._8_56_, local_178 < 3; local_178 = local_178 + 1) {
        VVar14 = Point3<float>::operator-(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        auVar8._0_8_ = VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar8._8_56_ = auVar12;
        vmovlpd_avx(auVar8._0_16_);
        VVar14 = Point3<float>::operator-(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        auVar9._0_8_ = VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar9._8_56_ = auVar12;
        vmovlpd_avx(auVar9._0_16_);
        VVar14 = Cross<float>((Vector3<float> *)in_stack_fffffffffffffe00,
                              (Vector3<float> *)in_stack_fffffffffffffdf8);
        auVar10._0_8_ = VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar10._8_56_ = auVar12;
        vmovlpd_avx(auVar10._0_16_);
        auVar11._0_4_ = Length<float>((Vector3<float> *)0x7950d4);
        auVar11._4_60_ = extraout_var;
        auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),auVar11._0_16_,
                                 ZEXT416((uint)in_RDI[2]));
        auVar7 = ZEXT1664(auVar2);
        in_RDI[2] = auVar2._0_4_;
      }
    }
  }
  return;
}

Assistant:

BilinearPatch::BilinearPatch(int meshIndex, int blpIndex)
    : meshIndex(meshIndex), blpIndex(blpIndex) {
    blpBytes += sizeof(*this);
    // Store area of bilinear patch in _area_
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    if (IsRectangle())
        area = Distance(p00, p01) * Distance(p00, p10);
    else {
        // Compute approximate area of bilinear patch
        // FIXME: it would be good to skip this for flat patches, or to
        // be adaptive based on curvature in some manner
        constexpr int na = 3;
        Point3f p[na + 1][na + 1];
        for (int i = 0; i <= na; ++i) {
            Float u = Float(i) / Float(na);
            for (int j = 0; j <= na; ++j) {
                Float v = Float(j) / Float(na);
                p[i][j] = Lerp(u, Lerp(v, p00, p01), Lerp(v, p10, p11));
            }
        }
        area = 0;
        for (int i = 0; i < na; ++i)
            for (int j = 0; j < na; ++j)
                area += 0.5f * Length(Cross(p[i + 1][j + 1] - p[i][j],
                                            p[i + 1][j] - p[i][j + 1]));
    }
}